

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O1

void aom_highbd_dc_left_predictor_16x4_c
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  uint16_t *puVar1;
  ulong uVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  int iVar6;
  long lVar7;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  
  uVar2 = *(ulong *)left;
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar2;
  auVar3._12_2_ = (short)(uVar2 >> 0x30);
  auVar4._8_2_ = (short)(uVar2 >> 0x20);
  auVar4._0_8_ = uVar2;
  auVar4._10_4_ = auVar3._10_4_;
  auVar5._6_8_ = 0;
  auVar5._0_6_ = auVar4._8_6_;
  auVar9 = ZEXT416((auVar3._10_4_ >> 0x10) +
                   (int)CONCAT82(SUB148(auVar5 << 0x40,6),(short)(uVar2 >> 0x10)) +
                   auVar4._8_4_ + (uint)(ushort)uVar2 + 2 >> 2);
  auVar9 = pshuflw(auVar9,auVar9,0);
  uVar8 = auVar9._0_4_;
  iVar6 = 0;
  do {
    lVar7 = 0;
    do {
      puVar1 = dst + lVar7;
      *(undefined4 *)puVar1 = uVar8;
      *(undefined4 *)(puVar1 + 2) = uVar8;
      *(undefined4 *)(puVar1 + 4) = uVar8;
      *(undefined4 *)(puVar1 + 6) = uVar8;
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0x10);
    iVar6 = iVar6 + 1;
    dst = dst + stride;
  } while (iVar6 != 4);
  return;
}

Assistant:

static inline void highbd_dc_left_predictor(uint16_t *dst, ptrdiff_t stride,
                                            int bw, int bh,
                                            const uint16_t *above,
                                            const uint16_t *left, int bd) {
  int i, r, expected_dc, sum = 0;
  (void)above;
  (void)bd;

  for (i = 0; i < bh; i++) sum += left[i];
  expected_dc = (sum + (bh >> 1)) / bh;

  for (r = 0; r < bh; r++) {
    aom_memset16(dst, expected_dc, bw);
    dst += stride;
  }
}